

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_1,int iteration)

{
  undefined4 in_register_00000014;
  String local_40;
  string local_30;
  
  String::Format((char *)&local_40,"event=TestIterationStart&iteration=%d\n",
                 CONCAT44(in_register_00000014,iteration));
  String::operator_cast_to_string(&local_30,&local_40);
  Send(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  String::~String(&local_40);
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    Send(String::Format("event=TestIterationStart&iteration=%d\n",
                        iteration));
  }